

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintFieldName
          (FieldValuePrinterWrapper *this,Message *message,int field_index,int field_count,
          Reflection *reflection,FieldDescriptor *field,BaseTextGenerator *generator)

{
  pointer pFVar1;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  string *in_stack_ffffffffffffffa8;
  BaseTextGenerator *in_stack_ffffffffffffffb0;
  string local_48 [32];
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_10;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_10 = in_RSI;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->((unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
                         *)0x44b44c);
  (*pFVar1->_vptr_FieldValuePrinter[0xc])(local_48,pFVar1,local_10,local_20,local_28);
  TextFormat::BaseTextGenerator::PrintString(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void PrintFieldName(const Message& message, int field_index, int field_count,
                      const Reflection* reflection,
                      const FieldDescriptor* field,
                      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(
        delegate_->PrintFieldName(message, reflection, field));
  }